

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O2

void Js::SCAPropBag::CreateInstance(ScriptContext *scriptContext,SCAPropBag **ppInstance)

{
  HeapAllocator *alloc;
  SCAPropBag *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_aae2d20;
  data.filename._0_4_ = 0x26;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
  this = (SCAPropBag *)new<Memory::HeapAllocator>(0x20,alloc,0x2f6726);
  SCAPropBag(this,scriptContext);
  *ppInstance = this;
  return;
}

Assistant:

void SCAPropBag::CreateInstance(ScriptContext* scriptContext, SCAPropBag** ppInstance)
    {
        *ppInstance = HeapNew(SCAPropBag, scriptContext);
    }